

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O1

void __thiscall
kj::Function<void_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++:211:40)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_mutex_test_c__:211:40)>
             *this)

{
  uint *puVar1;
  MutexGuarded<unsigned_int> *this_00;
  uint m;
  PredicateImpl_conflict impl;
  int local_74;
  MutexGuarded<unsigned_int> *local_70;
  uint *local_68;
  uint local_5c;
  Fault local_58 [2];
  DebugComparison<unsigned_int_&,_const_int_&> local_48;
  
  if (((this->f).i & 1) == 0) {
    usleep(10000);
  }
  this_00 = (this->f).value;
  local_74 = (this->f).i;
  local_48.left = (uint *)((ulong)local_48.left & 0xffffffffffffff00);
  _::Mutex::lock(&this_00->mutex,0);
  puVar1 = &this_00->value;
  local_48.left = (uint *)&PTR_check_00237ed8;
  local_48.right = &local_74;
  local_58[0].exception._0_1_ = 0;
  local_70 = this_00;
  local_68 = puVar1;
  local_48.op.content.ptr = (char *)puVar1;
  _::Mutex::wait(&this_00->mutex,&local_48);
  local_5c = *puVar1;
  *puVar1 = local_5c + 1;
  if (local_70 != (MutexGuarded<unsigned_int> *)0x0) {
    _::Mutex::unlock(&local_70->mutex,EXCLUSIVE,(Waiter *)0x0);
  }
  local_48.right = &(this->f).i;
  local_48.left = &local_5c;
  local_48.result = local_5c == ((anon_class_16_2_8fc7c391_for_f *)local_48.right)->i;
  local_48.op.content.ptr = " == ";
  local_48.op.content.size_ = 5;
  if (local_48.result) {
    return;
  }
  _::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,int_const&>&>
            (local_58,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
             ,0xd7,FAILED,"m == i","_kjCondition,",&local_48);
  _::Debug::Fault::fatal(local_58);
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }